

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_shared_expressions.cpp
# Opt level: O0

void duckdb::WindowSharedExpressions::PrepareExecutors
               (Shared *shared,ExpressionExecutor *exec,DataChunk *chunk)

{
  bool bVar1;
  const_iterator capacity_p;
  const_iterator this;
  reference poVar2;
  ExpressionExecutor *in_RDX;
  optional_ptr<const_duckdb::Expression,_true> expr;
  const_iterator __end1;
  const_iterator __begin1;
  vector<duckdb::optional_ptr<const_duckdb::Expression,_true>,_true> *__range1;
  vector<duckdb::LogicalType,_true> types;
  vector<duckdb::optional_ptr<const_duckdb::Expression,_true>,_true> sorted;
  vector<duckdb::optional_ptr<const_duckdb::Expression,_true>,_std::allocator<duckdb::optional_ptr<const_duckdb::Expression,_true>_>_>
  *in_stack_ffffffffffffff58;
  __normal_iterator<const_duckdb::optional_ptr<const_duckdb::Expression,_true>_*,_std::vector<duckdb::optional_ptr<const_duckdb::Expression,_true>,_std::allocator<duckdb::optional_ptr<const_duckdb::Expression,_true>_>_>_>
  *in_stack_ffffffffffffff60;
  LogicalType *in_stack_ffffffffffffff68;
  Expression *in_stack_ffffffffffffff70;
  Expression *expr_00;
  vector<duckdb::LogicalType,_true> *types_00;
  Allocator *in_stack_ffffffffffffffb8;
  DataChunk *in_stack_ffffffffffffffc0;
  vector<duckdb::LogicalType,_true> local_30;
  
  GetSortedExpressions((Shared *)in_RDX);
  vector<duckdb::LogicalType,_true>::vector((vector<duckdb::LogicalType,_true> *)0x1a45a6b);
  types_00 = &local_30;
  capacity_p = ::std::
               vector<duckdb::optional_ptr<const_duckdb::Expression,_true>,_std::allocator<duckdb::optional_ptr<const_duckdb::Expression,_true>_>_>
               ::begin(in_stack_ffffffffffffff58);
  this = ::std::
         vector<duckdb::optional_ptr<const_duckdb::Expression,_true>,_std::allocator<duckdb::optional_ptr<const_duckdb::Expression,_true>_>_>
         ::end(in_stack_ffffffffffffff58);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_ffffffffffffff60,
                       (__normal_iterator<const_duckdb::optional_ptr<const_duckdb::Expression,_true>_*,_std::vector<duckdb::optional_ptr<const_duckdb::Expression,_true>,_std::allocator<duckdb::optional_ptr<const_duckdb::Expression,_true>_>_>_>
                        *)in_stack_ffffffffffffff58);
    if (!bVar1) break;
    poVar2 = __gnu_cxx::
             __normal_iterator<const_duckdb::optional_ptr<const_duckdb::Expression,_true>_*,_std::vector<duckdb::optional_ptr<const_duckdb::Expression,_true>,_std::allocator<duckdb::optional_ptr<const_duckdb::Expression,_true>_>_>_>
             ::operator*((__normal_iterator<const_duckdb::optional_ptr<const_duckdb::Expression,_true>_*,_std::vector<duckdb::optional_ptr<const_duckdb::Expression,_true>,_std::allocator<duckdb::optional_ptr<const_duckdb::Expression,_true>_>_>_>
                          *)&stack0xffffffffffffffa8);
    expr_00 = poVar2->ptr;
    optional_ptr<const_duckdb::Expression,_true>::operator*
              ((optional_ptr<const_duckdb::Expression,_true> *)in_stack_ffffffffffffff60);
    ExpressionExecutor::AddExpression((ExpressionExecutor *)this._M_current,expr_00);
    in_stack_ffffffffffffff70 =
         optional_ptr<const_duckdb::Expression,_true>::operator->
                   ((optional_ptr<const_duckdb::Expression,_true> *)in_stack_ffffffffffffff60);
    ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
    emplace_back<duckdb::LogicalType_const&>
              ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
               in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    __gnu_cxx::
    __normal_iterator<const_duckdb::optional_ptr<const_duckdb::Expression,_true>_*,_std::vector<duckdb::optional_ptr<const_duckdb::Expression,_true>,_std::allocator<duckdb::optional_ptr<const_duckdb::Expression,_true>_>_>_>
    ::operator++((__normal_iterator<const_duckdb::optional_ptr<const_duckdb::Expression,_true>_*,_std::vector<duckdb::optional_ptr<const_duckdb::Expression,_true>,_std::allocator<duckdb::optional_ptr<const_duckdb::Expression,_true>_>_>_>
                  *)&stack0xffffffffffffffa8);
  }
  bVar1 = ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::empty
                    ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                     in_stack_ffffffffffffff70);
  if (!bVar1) {
    ExpressionExecutor::GetAllocator(in_RDX);
    DataChunk::Initialize
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,types_00,
               (idx_t)capacity_p._M_current);
  }
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x1a45b9d);
  vector<duckdb::optional_ptr<const_duckdb::Expression,_true>,_true>::~vector
            ((vector<duckdb::optional_ptr<const_duckdb::Expression,_true>,_true> *)0x1a45ba7);
  return;
}

Assistant:

void WindowSharedExpressions::PrepareExecutors(Shared &shared, ExpressionExecutor &exec, DataChunk &chunk) {
	const auto sorted = GetSortedExpressions(shared);
	vector<LogicalType> types;
	for (auto expr : sorted) {
		exec.AddExpression(*expr);
		types.emplace_back(expr->return_type);
	}

	if (!types.empty()) {
		chunk.Initialize(exec.GetAllocator(), types);
	}
}